

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::LoopSetInst::Exec
          (LoopSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Char CVar1;
  int iVar2;
  uint uVar3;
  PageAllocation *pPVar4;
  uint8 *puVar5;
  Program *pPVar6;
  code *pcVar7;
  bool bVar8;
  undefined4 *puVar9;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  Type pRVar10;
  size_t sVar11;
  uint8 *puVar12;
  uint uVar13;
  uint uVar14;
  LoopInfo *pLVar15;
  ArenaAllocator *alloc;
  
  iVar2 = (this->super_BeginLoopBasicsMixin).loopId;
  if (((long)iVar2 < 0) || (((matcher->program).ptr)->numLoops <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar8) goto LAB_00ef9a7e;
    *puVar9 = 0;
  }
  pLVar15 = (matcher->loopInfos).ptr + iVar2;
  if ((this->super_BeginLoopBasicsMixin).hasOuterLoops == true) {
    sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar11 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
      sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar8) goto LAB_00ef9a7e;
      *puVar9 = 0;
    }
    pPVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar11 + 0x28;
    *(size_t *)((long)&pPVar4[1].pageCount + sVar11) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    iVar2 = (this->super_BeginLoopBasicsMixin).loopId;
    *(undefined1 *)((long)&pPVar4[2].pageCount + sVar11) = 1;
    *(undefined ***)((long)&pPVar4[1].segment + sVar11) = &PTR_Print_01543488;
    *(int *)((long)&pPVar4[2].pageCount + sVar11 + 4) = iVar2;
    *(undefined8 *)((long)&pPVar4[2].segment + sVar11) = *(undefined8 *)pLVar15;
    *(undefined8 *)((long)&pPVar4[3].pageCount + sVar11) = 0;
    if (pLVar15->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014d5058;
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar4[3].pageCount + sVar11) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar15->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar3 = *inputOffset;
  pLVar15->startInputOffset = uVar3;
  uVar13 = (this->super_BeginLoopBasicsMixin).repeats.upper;
  uVar14 = uVar13 + uVar3;
  if (inputLength - uVar3 <= uVar13) {
    uVar14 = inputLength;
  }
  pRVar10 = matcher->stats;
  if (pRVar10 != (Type)0x0) {
    pRVar10->numCompares = pRVar10->numCompares + 1;
  }
  uVar13 = uVar3;
  if (uVar3 < uVar14) {
    do {
      CVar1 = input[uVar13];
      if ((ushort)CVar1 < 0x100) {
        if (((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar1 >> 5] >>
             ((ushort)CVar1 & 0x1f) & 1) == 0) break;
      }
      else {
        if ((this->super_SetMixin<false>).set.root == (CharSetNode *)0x0) break;
        bVar8 = RuntimeCharSet<char16_t>::Get_helper
                          (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar1);
        if (!bVar8) {
          uVar13 = *inputOffset;
          break;
        }
        pRVar10 = matcher->stats;
      }
      if (pRVar10 != (Type)0x0) {
        pRVar10->numCompares = pRVar10->numCompares + 1;
      }
      uVar13 = *inputOffset + 1;
      *inputOffset = uVar13;
    } while (uVar13 < uVar14);
  }
  uVar13 = uVar13 - uVar3;
  pLVar15->number = uVar13;
  uVar3 = (this->super_BeginLoopBasicsMixin).repeats.lower;
  if (uVar13 < uVar3) {
    bVar8 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    if (uVar3 < uVar13) {
      if ((LoopSetInst *)*instPointer != this) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xd75,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
        if (!bVar8) goto LAB_00ef9a7e;
        *puVar9 = 0;
      }
      sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.bufferSize;
      if (sVar11 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>)
                   .super_ContinuousPageStack<1UL>.nextTop < 0x18) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
        sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.bufferSize;
      }
      if (sVar11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                           ,199,"(bufferSize)","bufferSize");
        if (!bVar8) goto LAB_00ef9a7e;
        *puVar9 = 0;
      }
      pPVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar11 + 0x18;
      *(size_t *)((long)&pPVar4[1].pageCount + sVar11) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x18;
      puVar5 = *instPointer;
      pPVar6 = (matcher->program).ptr;
      puVar12 = *(uint8 **)&pPVar6->rep;
      if ((puVar5 < puVar12) || (puVar12 + (pPVar6->rep).insts.instsLen <= puVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x767,
                           "(inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen)"
                           ,
                           "inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen"
                          );
        if (!bVar8) {
LAB_00ef9a7e:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar9 = 0;
        puVar12 = *(uint8 **)&((matcher->program).ptr)->rep;
      }
      *(undefined1 *)((long)&pPVar4[2].pageCount + sVar11) = 8;
      *(undefined ***)((long)&pPVar4[1].segment + sVar11) = &PTR_Print_015433f8;
      *(int *)((long)&pPVar4[2].pageCount + sVar11 + 4) = (int)puVar5 - (int)puVar12;
      Matcher::PushStats(matcher,contStack,input);
    }
    *instPointer = *instPointer + 0x36;
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

inline bool LoopSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop is contained in an outer loop, continuation stack may already have a RewindLoopFixed entry for
        // this loop. We must make sure it's state is preserved on backtrack.
        if (hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // startInputOffset will stay here for all iterations, and we'll use number of length to figure out
        // where in the input to rewind to
        loopInfo->startInputOffset = inputOffset;

        // Consume as many elements of set as possible
        const RuntimeCharSet<Char>& matchSet = this->set;
        const CharCount loopMatchStart = inputOffset;
        const CharCountOrFlag repeatsUpper = repeats.upper;
        const CharCount inputEndOffset =
            static_cast<CharCount>(repeatsUpper) >= inputLength - inputOffset
                ? inputLength
                : inputOffset + static_cast<CharCount>(repeatsUpper);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputEndOffset && matchSet.Get(input[inputOffset]))
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        loopInfo->number = inputOffset - loopMatchStart;
        if (loopInfo->number < repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (loopInfo->number > repeats.lower)
        {
            // CHOICEPOINT: If follow fails, try consuming one fewer characters
            Assert(instPointer == (uint8*)this);
            PUSH(contStack, RewindLoopSetCont, matcher.InstPointerToLabel(instPointer));
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        // else: failure of follow signals failure of entire loop

        // Continue with follow
        instPointer += sizeof(*this);
        return false;
    }